

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

int serial_exitcode(Backend *be)

{
  Serial *serial;
  Backend *be_local;
  
  if (*(int *)&be[-4].interactor < 0) {
    be_local._4_4_ = 0x7fffffff;
  }
  else {
    be_local._4_4_ = -1;
  }
  return be_local._4_4_;
}

Assistant:

static int serial_exitcode(Backend *be)
{
    Serial *serial = container_of(be, Serial, backend);
    if (serial->fd >= 0)
        return -1;                     /* still connected */
    else
        /* Exit codes are a meaningless concept with serial ports */
        return INT_MAX;
}